

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O2

DdNode * Abc_NodeConeDcs(DdManager *dd,DdNode **pbVarsX,DdNode **pbVarsY,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vRoots,Vec_Ptr_t *vVisited)

{
  void *pvVar1;
  long *plVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  int iVar6;
  long lVar7;
  
  Abc_NodeConeCollect((Abc_Obj_t **)vRoots->pArray,vRoots->nSize,vLeaves,vVisited,0);
  for (lVar7 = 0; lVar7 < vLeaves->nSize; lVar7 = lVar7 + 1) {
    pvVar1 = Vec_PtrEntry(vLeaves,(int)lVar7);
    *(DdNode **)((long)pvVar1 + 0x40) = pbVarsX[lVar7];
  }
  for (iVar6 = 0; iVar6 < vVisited->nSize; iVar6 = iVar6 + 1) {
    plVar2 = (long *)Vec_PtrEntry(vVisited,iVar6);
    lVar7 = *(long *)(*(long *)(*plVar2 + 0x20) + 8);
    pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                            ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                            *(ulong *)(*(long *)(lVar7 + (long)*(int *)plVar2[4] * 8) + 0x40)),
                         (DdNode *)
                         ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 0xb & 1) ^
                         *(ulong *)(*(long *)(lVar7 + (long)((int *)plVar2[4])[1] * 8) + 0x40)));
    Cudd_Ref(pDVar3);
    plVar2[8] = (long)pDVar3;
  }
  pDVar3 = dd->one;
  Cudd_Ref(pDVar3);
  for (lVar7 = 0; lVar7 < vRoots->nSize; lVar7 = lVar7 + 1) {
    pvVar1 = Vec_PtrEntry(vRoots,(int)lVar7);
    pDVar4 = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar1 + 0x40),pbVarsY[lVar7]);
    Cudd_Ref(pDVar4);
    pDVar5 = Cudd_bddAnd(dd,pDVar3,pDVar4);
    Cudd_Ref(pDVar5);
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,pDVar4);
    pDVar3 = pDVar5;
  }
  for (iVar6 = 0; iVar6 < vVisited->nSize; iVar6 = iVar6 + 1) {
    pvVar1 = Vec_PtrEntry(vVisited,iVar6);
    Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar1 + 0x40));
  }
  pDVar4 = Extra_bddComputeRangeCube(dd,vRoots->nSize,vLeaves->nSize + vRoots->nSize);
  Cudd_Ref(pDVar4);
  pDVar5 = Cudd_bddExistAbstract(dd,pDVar3,pDVar4);
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(dd,pDVar4);
  Cudd_RecursiveDeref(dd,pDVar3);
  Cudd_Deref((DdNode *)((ulong)pDVar5 ^ 1));
  return (DdNode *)((ulong)pDVar5 ^ 1);
}

Assistant:

DdNode * Abc_NodeConeDcs( DdManager * dd, DdNode ** pbVarsX, DdNode ** pbVarsY, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, Vec_Ptr_t * vVisited )
{
    DdNode * bFunc0, * bFunc1, * bFunc, * bTrans, * bTemp, * bCube, * bResult;
    Abc_Obj_t * pNode;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( (Abc_Obj_t **)vRoots->pArray, vRoots->nSize, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVarsX[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    // compute the transition relation of the cone
    bTrans = b1;    Cudd_Ref( bTrans );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pNode, i )
    {
        bFunc = Cudd_bddXnor( dd, (DdNode *)pNode->pCopy, pbVarsY[i] );  Cudd_Ref( bFunc );
        bTrans = Cudd_bddAnd( dd, bTemp = bTrans, bFunc );               Cudd_Ref( bTrans );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bFunc );
    }
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    // compute don't-cares
    bCube = Extra_bddComputeRangeCube( dd, vRoots->nSize, vRoots->nSize + vLeaves->nSize );  Cudd_Ref( bCube );
    bResult = Cudd_bddExistAbstract( dd, bTrans, bCube );                Cudd_Ref( bResult );
    bResult = Cudd_Not( bResult );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_RecursiveDeref( dd, bTrans );
    Cudd_Deref( bResult );
    return bResult;
}